

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::Swap
          (GeneratedMessageReflection *this,Message *message1,Message *message2)

{
  float fVar1;
  double dVar2;
  bool bVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined8 uVar8;
  ulong uVar9;
  Message *pMVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  LogMessage *pLVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar14;
  RepeatedField<int> *this_00;
  RepeatedField<int> *other;
  uint *puVar15;
  uint *puVar16;
  RepeatedPtrFieldBase *this_01;
  RepeatedPtrFieldBase *other_00;
  RepeatedField<unsigned_long> *this_02;
  RepeatedField<unsigned_long> *other_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar18;
  RepeatedField<long> *this_03;
  RepeatedField<long> *other_02;
  bool *pbVar19;
  bool *pbVar20;
  RepeatedField<unsigned_int> *this_04;
  RepeatedField<unsigned_int> *other_03;
  RepeatedField<bool> *this_05;
  RepeatedField<bool> *other_04;
  double *pdVar21;
  double *pdVar22;
  float *pfVar23;
  float *pfVar24;
  RepeatedField<double> *this_06;
  RepeatedField<double> *other_05;
  RepeatedField<float> *this_07;
  RepeatedField<float> *other_06;
  ExtensionSet *this_08;
  ExtensionSet *x;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Descriptor *pDVar25;
  ulong uVar26;
  int i;
  long lVar27;
  FieldDescriptor *field;
  long lVar28;
  LogFinisher local_71;
  Message *local_70;
  LogMessage local_68;
  
  if (message1 != message2) {
    iVar11 = (*(message1->super_MessageLite)._vptr_MessageLite[0x12])(message1);
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var,iVar11) != this) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x13b);
      pLVar13 = LogMessage::operator<<
                          (&local_68,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar13 = LogMessage::operator<<(pLVar13,"First argument to Swap() (of type \"");
      iVar11 = (*(message1->super_MessageLite)._vptr_MessageLite[0x13])(message1);
      pLVar13 = LogMessage::operator<<(pLVar13,*(string **)(CONCAT44(extraout_var_00,iVar11) + 8));
      pLVar13 = LogMessage::operator<<
                          (pLVar13,
                           "\") is not compatible with this reflection object (which is for type \""
                          );
      pLVar13 = LogMessage::operator<<(pLVar13,*(string **)(this->descriptor_ + 8));
      pLVar13 = LogMessage::operator<<
                          (pLVar13,
                           "\").  Note that the exact same class is required; not just the same descriptor."
                          );
      LogFinisher::operator=(&local_71,pLVar13);
      LogMessage::~LogMessage(&local_68);
    }
    iVar11 = (*(message2->super_MessageLite)._vptr_MessageLite[0x12])(message2);
    if ((GeneratedMessageReflection *)CONCAT44(extraout_var_01,iVar11) != this) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x142);
      pLVar13 = LogMessage::operator<<
                          (&local_68,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar13 = LogMessage::operator<<(pLVar13,"Second argument to Swap() (of type \"");
      iVar11 = (*(message2->super_MessageLite)._vptr_MessageLite[0x13])(message2);
      pLVar13 = LogMessage::operator<<(pLVar13,*(string **)(CONCAT44(extraout_var_02,iVar11) + 8));
      pLVar13 = LogMessage::operator<<
                          (pLVar13,
                           "\") is not compatible with this reflection object (which is for type \""
                          );
      pLVar13 = LogMessage::operator<<(pLVar13,*(string **)(this->descriptor_ + 8));
      pLVar13 = LogMessage::operator<<
                          (pLVar13,
                           "\").  Note that the exact same class is required; not just the same descriptor."
                          );
      LogFinisher::operator=(&local_71,pLVar13);
      LogMessage::~LogMessage(&local_68);
    }
    lVar27 = (long)this->has_bits_offset_;
    pDVar25 = this->descriptor_;
    uVar9 = (long)(*(int *)(pDVar25 + 0x2c) + 0x1f) / 0x20;
    uVar26 = 0;
    uVar14 = uVar9 & 0xffffffff;
    if ((int)uVar9 < 1) {
      uVar14 = uVar26;
    }
    for (; uVar14 != uVar26; uVar26 = uVar26 + 1) {
      uVar4 = *(undefined4 *)
               ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar26 * 4 + lVar27);
      *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar26 * 4 + lVar27)
           = *(undefined4 *)
              ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar26 * 4 + lVar27);
      *(undefined4 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar26 * 4 + lVar27)
           = uVar4;
    }
    lVar28 = 0;
    local_70 = message1;
    for (lVar27 = 0; pMVar10 = local_70, lVar27 < *(int *)(pDVar25 + 0x2c); lVar27 = lVar27 + 1) {
      lVar6 = *(long *)(pDVar25 + 0x30);
      field = (FieldDescriptor *)(lVar6 + lVar28);
      if (*(int *)(lVar6 + 0x30 + lVar28) == 3) {
        switch(*(undefined4 *)
                (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar6 + 0x2c + lVar28) * 4))
        {
        case 1:
        case 8:
          this_00 = MutableRaw<google::protobuf::RepeatedField<int>>(this,local_70,field);
          other = MutableRaw<google::protobuf::RepeatedField<int>>(this,message2,field);
          RepeatedField<int>::Swap(this_00,other);
          break;
        case 2:
          this_03 = MutableRaw<google::protobuf::RepeatedField<long>>(this,local_70,field);
          other_02 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message2,field);
          RepeatedField<long>::Swap(this_03,other_02);
          break;
        case 3:
          this_04 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,local_70,field);
          other_03 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message2,field);
          RepeatedField<unsigned_int>::Swap(this_04,other_03);
          break;
        case 4:
          this_02 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,local_70,field);
          other_01 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message2,field)
          ;
          RepeatedField<unsigned_long>::Swap(this_02,other_01);
          break;
        case 5:
          this_06 = MutableRaw<google::protobuf::RepeatedField<double>>(this,local_70,field);
          other_05 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message2,field);
          RepeatedField<double>::Swap(this_06,other_05);
          break;
        case 6:
          this_07 = MutableRaw<google::protobuf::RepeatedField<float>>(this,local_70,field);
          other_06 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message2,field);
          RepeatedField<float>::Swap(this_07,other_06);
          break;
        case 7:
          this_05 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,local_70,field);
          other_04 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message2,field);
          RepeatedField<bool>::Swap(this_05,other_04);
          break;
        case 9:
        case 10:
          this_01 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                              (this,local_70,field);
          other_00 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                               (this,message2,field);
          RepeatedPtrFieldBase::Swap(this_01,other_00);
          break;
        default:
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                     ,0x16d);
          pLVar13 = LogMessage::operator<<(&local_68,"Unimplemented type: ");
          pLVar13 = LogMessage::operator<<
                              (pLVar13,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                               (ulong)*(uint *)(lVar6 + 0x2c + lVar28) * 4));
          LogFinisher::operator=(&local_71,pLVar13);
          goto LAB_0020e00f;
        }
        goto LAB_0020e04a;
      }
      switch(*(undefined4 *)
              (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar6 + 0x2c + lVar28) * 4)) {
      case 1:
      case 8:
        puVar15 = (uint *)MutableRaw<int>(this,local_70,field);
        puVar16 = (uint *)MutableRaw<int>(this,message2,field);
        goto LAB_0020de2d;
      case 2:
        ppbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   MutableRaw<long>(this,local_70,field);
        ppbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   MutableRaw<long>(this,message2,field);
        goto LAB_0020e03c;
      case 3:
        puVar15 = MutableRaw<unsigned_int>(this,local_70,field);
        puVar16 = MutableRaw<unsigned_int>(this,message2,field);
LAB_0020de2d:
        uVar5 = *puVar15;
        *puVar15 = *puVar16;
        *puVar16 = uVar5;
        break;
      case 4:
        ppbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   MutableRaw<unsigned_long>(this,local_70,field);
        ppbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   MutableRaw<unsigned_long>(this,message2,field);
        goto LAB_0020e03c;
      case 5:
        pdVar21 = MutableRaw<double>(this,local_70,field);
        pdVar22 = MutableRaw<double>(this,message2,field);
        dVar2 = *pdVar21;
        *pdVar21 = *pdVar22;
        *pdVar22 = dVar2;
        break;
      case 6:
        pfVar23 = MutableRaw<float>(this,local_70,field);
        pfVar24 = MutableRaw<float>(this,message2,field);
        fVar1 = *pfVar23;
        *pfVar23 = *pfVar24;
        *pfVar24 = fVar1;
        break;
      case 7:
        pbVar19 = MutableRaw<bool>(this,local_70,field);
        pbVar20 = MutableRaw<bool>(this,message2,field);
        bVar3 = *pbVar19;
        *pbVar19 = *pbVar20;
        *pbVar20 = bVar3;
        break;
      case 9:
        ppbVar17 = MutableRaw<std::__cxx11::string*>(this,local_70,field);
        ppbVar18 = MutableRaw<std::__cxx11::string*>(this,message2,field);
        goto LAB_0020e03c;
      case 10:
        ppbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   MutableRaw<google::protobuf::Message*>(this,local_70,field);
        ppbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   MutableRaw<google::protobuf::Message*>(this,message2,field);
LAB_0020e03c:
        pbVar7 = *ppbVar17;
        *ppbVar17 = *ppbVar18;
        *ppbVar18 = pbVar7;
        break;
      default:
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                   ,400);
        pLVar13 = LogMessage::operator<<(&local_68,"Unimplemented type: ");
        pLVar13 = LogMessage::operator<<
                            (pLVar13,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                             (ulong)*(uint *)(lVar6 + 0x2c + lVar28) * 4));
        LogFinisher::operator=(&local_71,pLVar13);
LAB_0020e00f:
        LogMessage::~LogMessage(&local_68);
      }
LAB_0020e04a:
      pDVar25 = this->descriptor_;
      lVar28 = lVar28 + 0x78;
    }
    if (this->extensions_offset_ != -1) {
      this_08 = MutableExtensionSet(this,local_70);
      x = MutableExtensionSet(this,message2);
      ExtensionSet::Swap(this_08,x);
    }
    iVar11 = (*(this->super_Reflection)._vptr_Reflection[3])(this,pMVar10);
    iVar12 = (*(this->super_Reflection)._vptr_Reflection[3])(this,message2);
    uVar8 = *(undefined8 *)CONCAT44(extraout_var_03,iVar11);
    *(undefined8 *)CONCAT44(extraout_var_03,iVar11) =
         *(undefined8 *)CONCAT44(extraout_var_04,iVar12);
    *(undefined8 *)CONCAT44(extraout_var_04,iVar12) = uVar8;
  }
  return;
}

Assistant:

void GeneratedMessageReflection::Swap(
    Message* message1,
    Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
    << "First argument to Swap() (of type \""
    << message1->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
    << "Second argument to Swap() (of type \""
    << message2->GetDescriptor()->full_name()
    << "\") is not compatible with this reflection object (which is for type \""
    << descriptor_->full_name()
    << "\").  Note that the exact same class is required; not just the same "
       "descriptor.";

  uint32* has_bits1 = MutableHasBits(message1);
  uint32* has_bits2 = MutableHasBits(message2);
  int has_bits_size = (descriptor_->field_count() + 31) / 32;

  for (int i = 0; i < has_bits_size; i++) {
    std::swap(has_bits1[i], has_bits2[i]);
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define SWAP_ARRAYS(CPPTYPE, TYPE)                                           \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          MutableRaw<RepeatedField<TYPE> >(message1, field)->Swap(           \
              MutableRaw<RepeatedField<TYPE> >(message2, field));            \
          break;

          SWAP_ARRAYS(INT32 , int32 );
          SWAP_ARRAYS(INT64 , int64 );
          SWAP_ARRAYS(UINT32, uint32);
          SWAP_ARRAYS(UINT64, uint64);
          SWAP_ARRAYS(FLOAT , float );
          SWAP_ARRAYS(DOUBLE, double);
          SWAP_ARRAYS(BOOL  , bool  );
          SWAP_ARRAYS(ENUM  , int   );
#undef SWAP_ARRAYS

        case FieldDescriptor::CPPTYPE_STRING:
        case FieldDescriptor::CPPTYPE_MESSAGE:
          MutableRaw<RepeatedPtrFieldBase>(message1, field)->Swap(
              MutableRaw<RepeatedPtrFieldBase>(message2, field));
          break;

        default:
          GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
      }
    } else {
      switch (field->cpp_type()) {
#define SWAP_VALUES(CPPTYPE, TYPE)                                           \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
          std::swap(*MutableRaw<TYPE>(message1, field),                      \
                    *MutableRaw<TYPE>(message2, field));                     \
          break;

          SWAP_VALUES(INT32 , int32 );
          SWAP_VALUES(INT64 , int64 );
          SWAP_VALUES(UINT32, uint32);
          SWAP_VALUES(UINT64, uint64);
          SWAP_VALUES(FLOAT , float );
          SWAP_VALUES(DOUBLE, double);
          SWAP_VALUES(BOOL  , bool  );
          SWAP_VALUES(ENUM  , int   );
#undef SWAP_VALUES
        case FieldDescriptor::CPPTYPE_MESSAGE:
          std::swap(*MutableRaw<Message*>(message1, field),
                    *MutableRaw<Message*>(message2, field));
          break;

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              std::swap(*MutableRaw<string*>(message1, field),
                        *MutableRaw<string*>(message2, field));
              break;
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Unimplemented type: " << field->cpp_type();
      }
    }
  }

  if (extensions_offset_ != -1) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}